

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O1

int flatcc_verify_struct_as_typed_root_with_size
              (void *buf,size_t bufsiz,flatbuffers_thash_t thash,size_t size,uint16_t align)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  size_t local_28;
  
  local_28 = bufsiz;
  iVar1 = flatcc_verify_typed_buffer_header_with_size(buf,&local_28,thash);
  if (iVar1 == 0) {
    iVar1 = 0x12;
    if (*(int *)((long)buf + 4) != 0) {
      uVar2 = *(int *)((long)buf + 4) + 4;
      if (uVar2 <= (uint)local_28) {
        iVar1 = 10;
        uVar3 = (uint)size + uVar2;
        if (!CARRY4((uint)size,uVar2)) {
          if ((uint)local_28 < uVar3) {
            iVar1 = (uVar3 <= (uint)local_28) + 9;
          }
          else {
            iVar1 = 0xb;
            if ((uVar2 & align - 1) == 0) {
              iVar1 = 0;
            }
          }
        }
      }
    }
  }
  else {
    iVar1 = flatcc_verify_typed_buffer_header_with_size(buf,&local_28,thash);
  }
  return iVar1;
}

Assistant:

int flatcc_verify_struct_as_typed_root_with_size(const void *buf, size_t bufsiz, flatbuffers_thash_t thash, size_t size, uint16_t align)
{
    check_result(flatcc_verify_typed_buffer_header_with_size(buf, &bufsiz, thash));
    return verify_struct((uoffset_t)bufsiz, uoffset_size, read_uoffset(buf, uoffset_size), (uoffset_t)size, align);
}